

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.cc
# Opt level: O2

int BUF_MEM_reserve(BUF_MEM *buf,size_t cap)

{
  int line;
  char *pcVar1;
  int iVar2;
  size_t new_size;
  
  if (buf->max < cap) {
    if (cap < 0xfffffffffffffffd) {
      if (cap < 0xbffffffffffffffd) {
        new_size = (cap + 3) / 3 << 2;
        pcVar1 = (char *)OPENSSL_realloc(buf->data,new_size);
        if (pcVar1 == (char *)0x0) {
          return 0;
        }
        buf->data = pcVar1;
        buf->max = new_size;
        goto LAB_0016de9d;
      }
      line = 0x32;
    }
    else {
      line = 0x2c;
    }
    iVar2 = 0;
    ERR_put_error(7,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf.cc"
                  ,line);
  }
  else {
LAB_0016de9d:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int BUF_MEM_reserve(BUF_MEM *buf, size_t cap) {
  if (buf->max >= cap) {
    return 1;
  }

  size_t n = cap + 3;
  if (n < cap) {
    OPENSSL_PUT_ERROR(BUF, ERR_R_OVERFLOW);
    return 0;
  }
  n = n / 3;
  size_t alloc_size = n * 4;
  if (alloc_size / 4 != n) {
    OPENSSL_PUT_ERROR(BUF, ERR_R_OVERFLOW);
    return 0;
  }

  char *new_buf =
      reinterpret_cast<char *>(OPENSSL_realloc(buf->data, alloc_size));
  if (new_buf == NULL) {
    return 0;
  }

  buf->data = new_buf;
  buf->max = alloc_size;
  return 1;
}